

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_loop.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseFor(Parser *this,bool isdo)

{
  Token *pTVar1;
  pointer pcVar2;
  istream *piVar3;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var4;
  size_t sVar5;
  bool bVar6;
  Lexer *this_00;
  uint in_EDX;
  undefined7 in_register_00000031;
  Parser *this_01;
  pointer __old_p;
  Lexer *pLVar7;
  pointer __p;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_90;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_88;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_80;
  Position local_78;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  __uniq_ptr_impl<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> local_50;
  undefined1 local_48 [16];
  
  this_01 = (Parser *)CONCAT71(in_register_00000031,isdo);
  if (in_EDX == 0) {
    sanityExpect(this_01,TOK_KW_FOR);
    local_80._M_head_impl = (Expr *)0x0;
    local_90._M_head_impl = (Expr *)0x0;
    parseExpression((Parser *)&local_78,isdo);
    pLVar7 = (Lexer *)local_78.line;
    local_88._M_head_impl = (Expr *)local_78.line;
    bVar6 = expect(this_01,TOK_STMT);
    if (bVar6) {
      skipEol(this_01);
      parseExpression((Parser *)&local_78,isdo);
      sVar5 = local_78.line;
      local_90._M_head_impl = (Expr *)local_78.line;
      bVar6 = expect(this_01,TOK_STMT);
      if (bVar6) {
        skipEol(this_01);
        local_80._M_head_impl = (Expr *)pLVar7;
        local_88._M_head_impl = (Expr *)sVar5;
        parseExpression((Parser *)&local_78,isdo);
        local_90._M_head_impl = (Expr *)local_78.line;
        pLVar7 = (Lexer *)sVar5;
      }
    }
  }
  else {
    sanityExpect(this_01,TOK_KW_DO);
    local_80._M_head_impl = (Expr *)0x0;
    local_88._M_head_impl = (Expr *)0x0;
    local_90._M_head_impl = (Expr *)0x0;
    bVar6 = Token::operator!=(this_01->lexer->currentToken,TOK_EOL);
    pLVar7 = (Lexer *)0x0;
    if (bVar6) {
      bVar6 = Token::operator!=(this_01->lexer->currentToken,TOK_EOF);
      if (bVar6) {
        parseExpression((Parser *)&local_78,isdo);
        local_80._M_head_impl = (Expr *)local_78.line;
        pLVar7 = (Lexer *)0x0;
      }
      else {
        pLVar7 = (Lexer *)0x0;
      }
    }
  }
  bVar6 = expect(this_01,TOK_EOL);
  if (!bVar6) {
    pTVar1 = this_01->lexer->currentToken;
    local_78.line = (size_t)operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&((Lexer *)local_78.line)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_78.line)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)&((Lexer *)local_78.line)->cfg)->line = (pTVar1->pos).line;
    ((Lexer *)local_78.line)->input = piVar3;
    (((Lexer *)local_78.line)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_78.line)->filePath)._M_string_length = 0;
    (((Lexer *)local_78.line)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_78.line)->filePath).field_2 + 8) = 0;
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    if ((Lexer *)local_78.line != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_78,
                 (Error<pfederc::SyntaxErrorCode> *)local_78.line);
    }
    skipToEol(this_01);
  }
  parseFunctionBody((Parser *)&bodyExpr);
  bVar6 = expect(this_01,TOK_STMT);
  if (!bVar6) {
    pTVar1 = this_01->lexer->currentToken;
    local_78.line = (size_t)operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&((Lexer *)local_78.line)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_78.line)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)&((Lexer *)local_78.line)->cfg)->line = (pTVar1->pos).line;
    ((Lexer *)local_78.line)->input = piVar3;
    (((Lexer *)local_78.line)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_78.line)->filePath)._M_string_length = 0;
    (((Lexer *)local_78.line)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_78.line)->filePath).field_2 + 8) = 0;
    generateError((Parser *)(local_48 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_01);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_48 + 8));
    if ((Lexer *)local_78.line != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_78,
                 (Error<pfederc::SyntaxErrorCode> *)local_78.line);
    }
  }
  if ((char)in_EDX != '\0') {
    bVar6 = expect(this_01,TOK_KW_FOR);
    if (bVar6) {
      parseExpression((Parser *)&local_78,isdo);
      local_88._M_head_impl = (Expr *)local_78.line;
      local_78.line = 0;
      if ((pLVar7 != (Lexer *)0x0) &&
         ((*pLVar7->_vptr_Lexer[1])(pLVar7), (Lexer *)local_78.line != (Lexer *)0x0)) {
        (*(*(_func_int ***)local_78.line)[1])();
      }
      bVar6 = expect(this_01,TOK_STMT);
      if (bVar6) {
        skipEol(this_01);
        parseExpression((Parser *)&local_78,isdo);
        sVar5 = local_78.line;
        _Var4._M_head_impl = local_90._M_head_impl;
        local_78.line = 0;
        local_90._M_head_impl = (Expr *)sVar5;
        if (((Lexer *)_Var4._M_head_impl != (Lexer *)0x0) &&
           ((*(_Var4._M_head_impl)->_vptr_Expr[1])(), (Lexer *)local_78.line != (Lexer *)0x0)) {
          (*(*(_func_int ***)local_78.line)[1])();
        }
      }
    }
    else {
      pTVar1 = this_01->lexer->currentToken;
      local_78.line = (size_t)operator_new(0x38);
      pcVar2 = (pointer)(pTVar1->pos).endIndex;
      *(Level *)&((Lexer *)local_78.line)->_vptr_Lexer = LVL_ERROR;
      *(SyntaxErrorCode *)((long)&((Lexer *)local_78.line)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_FOR;
      piVar3 = (istream *)(pTVar1->pos).startIndex;
      ((Position *)&((Lexer *)local_78.line)->cfg)->line = (pTVar1->pos).line;
      ((Lexer *)local_78.line)->input = piVar3;
      (((Lexer *)local_78.line)->filePath)._M_dataplus._M_p = pcVar2;
      (((Lexer *)local_78.line)->filePath)._M_string_length = 0;
      (((Lexer *)local_78.line)->filePath).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(((Lexer *)local_78.line)->filePath).field_2 + 8) = 0;
      generateError((Parser *)local_48,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this_01);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_48);
      if ((Lexer *)local_78.line != (Lexer *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_78,
                   (Error<pfederc::SyntaxErrorCode> *)local_78.line);
      }
      skipToEol(this_01);
    }
  }
  if (((Lexer *)local_88._M_head_impl == (Lexer *)0x0) ||
     ((__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)
      bodyExpr._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>)0x0)) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    local_78.line =
         (size_t)(((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
                  &((local_88._M_head_impl)->pos).line)->_M_impl).super__Vector_impl_data._M_start;
    local_78.startIndex = ((local_88._M_head_impl)->pos).startIndex;
    local_78.endIndex = ((local_88._M_head_impl)->pos).endIndex;
    pLVar7 = this_01->lexer;
    this_00 = (Lexer *)operator_new(0x58);
    LoopExpr::LoopExpr((LoopExpr *)this_00,pLVar7,(in_EDX & 0xff) + EXPR_LOOP_FOR,&local_78,
                       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_80,
                       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_88,
                       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_90,
                       &bodyExpr);
    local_50._M_t.
    super__Tuple_impl<0UL,_pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>.
    super__Head_base<0UL,_pfederc::LoopExpr_*,_false>._M_head_impl =
         (tuple<pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>)
         (_Tuple_impl<0UL,_pfederc::LoopExpr_*,_std::default_delete<pfederc::LoopExpr>_>)0x0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LoopExpr,_std::default_delete<pfederc::LoopExpr>_> *)&local_50);
  }
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&bodyExpr);
  if ((Lexer *)local_90._M_head_impl != (Lexer *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Expr[1])();
  }
  if ((Lexer *)local_88._M_head_impl != (Lexer *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Expr[1])();
  }
  if ((Lexer *)local_80._M_head_impl != (Lexer *)0x0) {
    (*(local_80._M_head_impl)->_vptr_Expr[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseFor(bool isdo) noexcept {
  if (isdo)
    sanityExpect(TokenType::TOK_KW_DO);
  else
    sanityExpect(TokenType::TOK_KW_FOR);

  std::unique_ptr<Expr> initExpr, condExpr, itExpr;

  if (isdo) {
    if (*lexer.getCurrentToken() != TokenType::TOK_EOL
        && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
      initExpr = parseExpression();
    }
  } else {
    condExpr = parseExpression();
    if (expect(TokenType::TOK_STMT)) {
      skipEol();
      itExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        // switch expressions
        initExpr = std::move(condExpr);
        condExpr = std::move(itExpr);
        itExpr = parseExpression();
      }
    }
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL,
          lexer.getCurrentToken()->getPosition()));
  }

  if (isdo) {
    if (!expect(TokenType::TOK_KW_FOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_FOR,
            lexer.getCurrentToken()->getPosition()));
      skipToEol();
    } else {
      condExpr = parseExpression();
      if (expect(TokenType::TOK_STMT)) {
        skipEol();
        itExpr = parseExpression();
      }
    }
  }

  if (!condExpr || !bodyExpr)
    return nullptr;

  Position pos = condExpr->getPosition();

  return std::make_unique<LoopExpr>(lexer,
      isdo ? ExprType::EXPR_LOOP_DO : ExprType::EXPR_LOOP_FOR, pos,
      std::move(initExpr), std::move(condExpr), std::move(itExpr),
      std::move(bodyExpr));
}